

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-decoder.c
# Opt level: O1

int mg_session_read_map(mg_session *session,mg_map **map)

{
  int iVar1;
  int iVar2;
  mg_map *buf;
  int iVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  uint32_t size;
  ulong local_48;
  uint local_34;
  
  iVar1 = mg_session_read_container_size(session,&local_34,MG_MARKERS_MAP);
  if (iVar1 == 0) {
    buf = mg_map_alloc(local_34,session->decoder_allocator);
    if (buf == (mg_map *)0x0) {
      mg_session_set_error(session,"out of memory");
      iVar1 = -3;
    }
    else {
      buf->size = local_34;
      iVar3 = 4;
      if (local_34 == 0) {
        uVar6 = 0;
        iVar2 = 0;
        local_48 = 0;
      }
      else {
        lVar4 = 0;
        local_48 = 0;
        do {
          iVar2 = mg_session_read_string(session,(mg_string **)((long)buf->keys + lVar4));
          uVar6 = (uint)local_48;
          if (iVar2 != 0) {
LAB_00106b6b:
            iVar3 = 7;
            goto LAB_00106b74;
          }
          iVar2 = mg_session_read_value(session,(mg_value **)((long)buf->values + lVar4));
          if (iVar2 != 0) {
            local_48 = (ulong)(uVar6 + 1);
            goto LAB_00106b6b;
          }
          local_48 = (ulong)(uVar6 + 1);
          lVar4 = lVar4 + 8;
        } while ((ulong)local_34 * 8 - lVar4 != 0);
        iVar2 = 0;
        iVar3 = 4;
        uVar6 = local_34;
        local_48 = (ulong)local_34;
      }
LAB_00106b74:
      if (iVar3 == 4) {
        *map = buf;
        iVar1 = 0;
      }
      else if (iVar3 == 7) {
        if ((int)local_48 != 0) {
          uVar5 = 0;
          do {
            mg_string_destroy_ca(buf->keys[uVar5],session->decoder_allocator);
            uVar5 = uVar5 + 1;
          } while (local_48 != uVar5);
        }
        if (uVar6 != 0) {
          uVar5 = 0;
          do {
            mg_value_destroy_ca(buf->values[uVar5],session->decoder_allocator);
            uVar5 = uVar5 + 1;
          } while (uVar6 != uVar5);
        }
        mg_allocator_free(session->decoder_allocator,buf);
        iVar1 = iVar2;
      }
    }
  }
  return iVar1;
}

Assistant:

int mg_session_read_map(mg_session *session, mg_map **map) {
  uint32_t size;
  MG_RETURN_IF_FAILED(
      mg_session_read_container_size(session, &size, MG_MARKERS_MAP));

  mg_map *tmap = mg_map_alloc(size, session->decoder_allocator);
  if (!tmap) {
    mg_session_set_error(session, "out of memory");
    return MG_ERROR_OOM;
  }

  int status = 0;

  tmap->size = size;

  uint32_t keys_read = 0;
  uint32_t values_read = 0;
  for (uint32_t i = 0; i < size; ++i) {
    status = mg_session_read_string(session, &tmap->keys[i]);
    if (status != 0) {
      goto cleanup;
    }
    keys_read++;
    status = mg_session_read_value(session, &tmap->values[i]);
    if (status != 0) {
      goto cleanup;
    }
    values_read++;
  }

  *map = tmap;
  return 0;

cleanup:
  for (uint32_t i = 0; i < keys_read; ++i) {
    mg_string_destroy_ca(tmap->keys[i], session->decoder_allocator);
  }
  for (uint32_t i = 0; i < values_read; ++i) {
    mg_value_destroy_ca(tmap->values[i], session->decoder_allocator);
  }
  mg_allocator_free(session->decoder_allocator, tmap);
  return status;
}